

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

ssize_t hwrite2(hFILE *fp,void *srcv,size_t totalbytes,size_t ncopied)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  size_t __n;
  void *__src;
  
  pcVar1 = fp->limit;
  pcVar2 = fp->buffer;
  sVar3 = flush_buffer(fp);
  if (-1 < (long)sVar3) {
    __src = (void *)((long)srcv + ncopied);
    for (__n = totalbytes - ncopied; (ulong)((long)pcVar1 - (long)pcVar2) <= __n * 2;
        __n = __n - sVar4) {
      sVar4 = (*fp->backend->write)(fp,__src,__n);
      if (sVar4 < 0) {
        piVar5 = __errno_location();
        fp->has_errno = *piVar5;
        return sVar4;
      }
      fp->offset = fp->offset + sVar4;
      __src = (void *)((long)__src + sVar4);
    }
    memcpy(fp->begin,__src,__n);
    fp->begin = fp->begin + __n;
    sVar3 = totalbytes;
  }
  return sVar3;
}

Assistant:

ssize_t hwrite2(hFILE *fp, const void *srcv, size_t totalbytes, size_t ncopied)
{
    const char *src = (const char *) srcv;
    ssize_t ret;
    const size_t capacity = fp->limit - fp->buffer;
    size_t remaining = totalbytes - ncopied;
    src += ncopied;

    ret = flush_buffer(fp);
    if (ret < 0) return ret;

    // Write large blocks out directly from the source buffer
    while (remaining * 2 >= capacity) {
        ssize_t n = fp->backend->write(fp, src, remaining);
        if (n < 0) { fp->has_errno = errno; return n; }
        fp->offset += n;
        src += n, remaining -= n;
    }

    // Just buffer any remaining characters
    memcpy(fp->begin, src, remaining);
    fp->begin += remaining;

    return totalbytes;
}